

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O1

void __thiscall relive::ReLiveDB::setConfigValueString(ReLiveDB *this,string *key,string *value)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  double __x;
  KeyValue kv;
  string local_248;
  long *local_228 [2];
  long local_218 [2];
  long *local_208 [2];
  long local_1f8 [2];
  string local_1e8;
  long *local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [32];
  _Alloc_hider local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [4];
  ios_base local_138 [264];
  
  if (setConfigValueString::_isActive) {
    if (((byte)setConfigValueString::_init._M_base._M_i & 1) == 0) {
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"N6relive8ReLiveDBE","");
      stripTypeName((string *)local_1a8,&local_248);
      LogManager::registerIsActive
                ((string *)local_1a8,2,&setConfigValueString::_init,&setConfigValueString::_isActive
                );
      if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
      }
      if (setConfigValueString::_isActive == false) goto LAB_00131eba;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Setting config value: ",0x16);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(key->_M_dataplus)._M_p,key->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," = \'",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(value->_M_dataplus)._M_p,value->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'",1);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"N6relive8ReLiveDBE","");
    stripTypeName(&local_248,&local_1e8);
    local_228[0] = local_218;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_228,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/src/backend/relivedb.cpp"
               ,"");
    local_208[0] = local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_208,
               "void relive::ReLiveDB::setConfigValueString(const std::string &, const std::string &)"
               ,"");
    __x = (double)std::__cxx11::stringbuf::str();
    LogManager::log(__x);
    if (local_1c8 != local_1b8) {
      operator_delete(local_1c8,local_1b8[0] + 1);
    }
    if (local_208[0] != local_1f8) {
      operator_delete(local_208[0],local_1f8[0] + 1);
    }
    if (local_228[0] != local_218) {
      operator_delete(local_228[0],local_218[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
LAB_00131eba:
  pcVar1 = (key->_M_dataplus)._M_p;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a8,pcVar1,pcVar1 + key->_M_string_length);
  pcVar1 = (value->_M_dataplus)._M_p;
  local_188._M_p = (pointer)local_178;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,pcVar1,pcVar1 + value->_M_string_length);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->_mutex);
  if (iVar2 == 0) {
    storage_abi_cxx11_();
    sqlite_orm::internal::storage_t<$86c824a$>::replace<relive::KeyValue>
              (&storage[abi:cxx11]()::_storage_abi_cxx11_,(KeyValue *)local_1a8);
    pthread_mutex_unlock((pthread_mutex_t *)&this->_mutex);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_p != local_178) {
      operator_delete(local_188._M_p,local_178[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void ReLiveDB::setConfigValueString(const std::string& key, const std::string& value)
{
    using namespace sqlite_orm;
    DEBUG_LOG(2, "Setting config value: " << key << " = '" << value << "'");
    KeyValue kv{key, value};
    std::lock_guard<Mutex> lock{_mutex};
    storage().replace(kv);
}